

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O0

void __thiscall ThreadPool::WorkOrWait(ThreadPool *this,unique_lock<std::mutex> *lock)

{
  bool bVar1;
  undefined8 in_RSI;
  ParallelJob *in_RDI;
  ParallelJob *job;
  byte local_21;
  mutex_type *local_18;
  
  local_18 = (mutex_type *)in_RDI->_vptr_ParallelJob;
  while( true ) {
    local_21 = 0;
    if (local_18 != (mutex_type *)0x0) {
      local_21 = (**(code **)((local_18->super___mutex_base)._M_mutex.__align + 0x18))();
      local_21 = local_21 ^ 0xff;
    }
    if ((local_21 & 1) == 0) break;
    local_18 = *(mutex_type **)((long)&(local_18->super___mutex_base)._M_mutex + 0x10);
  }
  if (local_18 == (mutex_type *)0x0) {
    std::condition_variable::wait((unique_lock *)&in_RDI[1].next);
  }
  else {
    *(int *)((long)&(local_18->super___mutex_base)._M_mutex + 0x18) =
         *(int *)((long)&(local_18->super___mutex_base)._M_mutex + 0x18) + 1;
    (**(code **)((local_18->super___mutex_base)._M_mutex.__align + 0x10))(local_18,in_RSI);
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)in_RDI);
    *(int *)((long)&(local_18->super___mutex_base)._M_mutex + 0x18) =
         *(int *)((long)&(local_18->super___mutex_base)._M_mutex + 0x18) + -1;
    bVar1 = ParallelJob::Finished(in_RDI);
    if (bVar1) {
      std::condition_variable::notify_all();
    }
  }
  return;
}

Assistant:

void ThreadPool::WorkOrWait(std::unique_lock<std::mutex> *lock) {
    assert(lock->owns_lock());

    ParallelJob *job = jobList;
    while ((job != nullptr) && !job->HaveWork())
        job = job->next;
    if (job != nullptr) {
        // Run a chunk of loop iterations for _loop_
        job->activeWorkers++;

        job->RunStep(lock);

        assert(!lock->owns_lock());
        lock->lock();

        // Update _loop_ to reflect completion of iterations
        job->activeWorkers--;

        if (job->Finished())
            jobListCondition.notify_all();
    } else
        // Wait for something to change (new work, or this loop being
        // finished).
        jobListCondition.wait(*lock);
}